

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O0

void nn_sinproc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_sinproc *local_30;
  nn_sinproc *sinproc;
  void *srcptr_local;
  int type_local;
  int src_local;
  nn_fsm *self_local;
  
  local_30 = (nn_sinproc *)self;
  if (self == (nn_fsm *)0x0) {
    local_30 = (nn_sinproc *)0x0;
  }
  if ((local_30->fsm).state != 3) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sinproc->fsm.state == 3",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/sinproc.c"
            ,0x115);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_sinproc_shutdown_events(local_30,src,type,srcptr);
  if (((local_30->state == 7) &&
      (iVar1 = nn_fsm_event_active(&local_30->event_received), iVar1 == 0)) &&
     (iVar1 = nn_fsm_event_active(&local_30->event_disconnect), iVar1 == 0)) {
    iVar1 = nn_fsm_event_active(&local_30->event_connect);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "!nn_fsm_event_active (&sinproc->event_connect)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/sinproc.c"
              ,0x129);
      fflush(_stderr);
      nn_err_abort();
    }
    iVar1 = nn_fsm_event_active(&local_30->event_sent);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!nn_fsm_event_active (&sinproc->event_sent)"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/sinproc.c"
              ,0x12a);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_fsm_stopped(&local_30->fsm,7);
  }
  return;
}

Assistant:

static void nn_sinproc_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sinproc *sinproc;

    sinproc = nn_cont (self, struct nn_sinproc, fsm);
    nn_assert (sinproc->fsm.state == 3);

    nn_sinproc_shutdown_events (sinproc, src, type, srcptr);

    /*  ***************  */
    /*  States to check  */
    /*  ***************  */

    /*  Have we got notification that peer is stopped  */
    if (nn_slow (sinproc->state != NN_SINPROC_STATE_STOPPING)) {
        return;
    }

    /*  Are all events processed? We can't cancel them unfortunately  */
    if (nn_fsm_event_active (&sinproc->event_received)
        || nn_fsm_event_active (&sinproc->event_disconnect))
    {
        return;
    }
    /*  These events are deemed to be impossible here  */
    nn_assert (!nn_fsm_event_active (&sinproc->event_connect));
    nn_assert (!nn_fsm_event_active (&sinproc->event_sent));

    /*  **********************************************  */
    /*  All checks are successful. Just stop right now  */
    /*  **********************************************  */

    nn_fsm_stopped (&sinproc->fsm, NN_SINPROC_STOPPED);
    return;
}